

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

void __thiscall Clasp::DefaultUnfoundedCheck::propagateSource(DefaultUnfoundedCheck *this)

{
  bool bVar1;
  size_type sVar2;
  reference puVar3;
  reference this_00;
  DefaultUnfoundedCheck *in_RDI;
  NodeId atom;
  size_type i;
  AtomNode *in_stack_ffffffffffffffb8;
  NodeId atomId;
  PrgDepGraph *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar4;
  RemoveSource local_28;
  AddSource local_18;
  size_type local_10;
  uint local_c;
  
  local_c = 0;
  while( true ) {
    uVar4 = local_c;
    sVar2 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->sourceQ_)
    ;
    if (sVar2 <= uVar4) break;
    puVar3 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&in_RDI->sourceQ_,local_c);
    local_10 = *puVar3;
    this_00 = bk_lib::
              pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
              ::operator[](&in_RDI->atoms_,local_10);
    bVar1 = AtomData::hasSource(this_00);
    atomId = (NodeId)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    if (bVar1) {
      in_stack_ffffffffffffffc0 =
           (PrgDepGraph *)Asp::PrgDepGraph::getAtom(in_stack_ffffffffffffffc0,atomId);
      AddSource::AddSource(&local_18,in_RDI);
      Asp::PrgDepGraph::AtomNode::visitSuccessors<Clasp::DefaultUnfoundedCheck::AddSource>
                ((AtomNode *)in_RDI,(AddSource *)CONCAT44(uVar4,in_stack_ffffffffffffffc8));
    }
    else {
      in_stack_ffffffffffffffb8 = Asp::PrgDepGraph::getAtom(in_stack_ffffffffffffffc0,atomId);
      RemoveSource::RemoveSource(&local_28,in_RDI,false);
      Asp::PrgDepGraph::AtomNode::visitSuccessors<Clasp::DefaultUnfoundedCheck::RemoveSource>
                ((AtomNode *)in_RDI,(RemoveSource *)CONCAT44(uVar4,in_stack_ffffffffffffffc8));
    }
    local_c = local_c + 1;
  }
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&in_RDI->sourceQ_);
  return;
}

Assistant:

void DefaultUnfoundedCheck::propagateSource() {
	for (LitVec::size_type i = 0; i < sourceQ_.size(); ++i) {
		NodeId atom = sourceQ_[i];
		if (atoms_[atom].hasSource()) {
			// propagate a newly added source-pointer
			graph_->getAtom(atom).visitSuccessors(AddSource(this));
		}
		else {
			graph_->getAtom(atom).visitSuccessors(RemoveSource(this));
		}
	}
	sourceQ_.clear();
}